

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O1

int cppcms_capi_session_set_session_cookie(cppcms_capi_session *session,char *session_cookie_value)

{
  char *pcVar1;
  int iVar2;
  
  iVar2 = -1;
  if (session != (cppcms_capi_session *)0x0) {
    anon_unknown.dwarf_41bcbf::check_str(session_cookie_value);
    cppcms_capi_session::check(session);
    pcVar1 = (char *)(session->adapter).value._M_string_length;
    strlen(session_cookie_value);
    iVar2 = 0;
    std::__cxx11::string::_M_replace
              ((ulong)&(session->adapter).value,0,pcVar1,(ulong)session_cookie_value);
  }
  return iVar2;
}

Assistant:

int cppcms_capi_session_set_session_cookie(cppcms_capi_session *session,char const *session_cookie_value)
{
	TRY {
		if(!session)
			return -1;
		check_str(session_cookie_value);
		session->check();
		session->adapter.value = session_cookie_value;
	}